

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdiriterator.cpp
# Opt level: O2

int __thiscall QDirIteratorPrivate::init(QDirIteratorPrivate *this,EVP_PKEY_CTX *ctx)

{
  totally_ordered_wrapper<QFileInfoPrivate_*> tVar1;
  const_iterator cVar2;
  long in_FS_OFFSET;
  QSharedDataPointer<QFileInfoPrivate> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QDirListing::begin(&this->lister);
  (this->it).dirEntry.dirListPtr = (QDirListingPrivate *)cVar2.dirEntry.dirListPtr;
  if (cVar2.dirEntry.dirListPtr != (QDirListingPrivate *)0x0) {
    QDirListing::DirEntry::fileInfo((DirEntry *)&local_20);
    tVar1.ptr = (this->nextFileInfo).d_ptr.d.ptr;
    (this->nextFileInfo).d_ptr.d.ptr = (QFileInfoPrivate *)local_20.d.ptr;
    local_20.d.ptr =
         (totally_ordered_wrapper<QFileInfoPrivate_*>)
         (totally_ordered_wrapper<QFileInfoPrivate_*>)tVar1.ptr;
    QFileInfo::~QFileInfo((QFileInfo *)&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void init()
    {
        it = lister.begin();
        if (it != lister.end())
            nextFileInfo = it->fileInfo();
    }